

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

int __thiscall Conn::init(Conn *this,EVP_PKEY_CTX *ctx)

{
  int in_EDX;
  int max_conn_size_local;
  int listen_fd_local;
  Conn *this_local;
  
  this->_listen_fd = (int)ctx;
  this->_cur_conn_size = 0;
  this->_max_conn_size = in_EDX;
  Epoll::create_epool(&this->_epoll,this->_max_conn_size);
  this->_cur_handler = 0;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool Conn::init(const int listen_fd, const int max_conn_size)
{
    _listen_fd = listen_fd;
    _cur_conn_size = 0;
    _max_conn_size = max_conn_size;

    _epoll.create_epool(_max_conn_size);

    _cur_handler = 0;

    return true;
}